

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void Catch::handleExceptionMatchExpr(AssertionHandler *handler,StringMatcher *matcher)

{
  int iVar1;
  string exceptionMessage;
  MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Catch::Matchers::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  expr;
  string asStack_58 [32];
  undefined **local_38;
  undefined1 local_30;
  undefined1 local_2f;
  undefined1 *local_28;
  StringMatcher *local_20;
  
  translateActiveException_abi_cxx11_();
  iVar1 = (*(matcher->super_MatcherUntypedBase)._vptr_MatcherUntypedBase[3])(matcher,asStack_58);
  local_30 = 1;
  local_2f = (undefined1)iVar1;
  local_38 = &PTR_streamReconstructedExpression_002f7820;
  local_28 = asStack_58;
  local_20 = matcher;
  (*handler->m_resultCapture->_vptr_IResultCapture[0x10])
            (handler->m_resultCapture,handler,&local_38,&handler->m_reaction);
  std::__cxx11::string::~string(asStack_58);
  return;
}

Assistant:

void handleExceptionMatchExpr( AssertionHandler& handler, StringMatcher const& matcher ) {
        std::string exceptionMessage = Catch::translateActiveException();
        MatchExpr<std::string, StringMatcher const&> expr( CATCH_MOVE(exceptionMessage), matcher );
        handler.handleExpr( expr );
    }